

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxKeyboard.cpp
# Opt level: O0

void __thiscall OIS::LinuxKeyboard::_handleKeyPress(LinuxKeyboard *this,XEvent *event)

{
  LinuxKeyboard *pLVar1;
  int iVar2;
  KeyCode kc_00;
  vector<char,_std::allocator<char>_> *this_00;
  size_type sVar3;
  reference pvVar4;
  uchar *buf;
  LinuxKeyboard *in_RSI;
  long in_RDI;
  LinuxInputManager *linMan;
  KeyCode kc;
  int status;
  bool haveChar;
  int bytes;
  uint character;
  KeySym keySym;
  XKeyEvent *e;
  allocator_type *in_stack_ffffffffffffff80;
  LinuxKeyboard *in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar5;
  uint uVar6;
  int local_40;
  long local_38 [3];
  allocator<char> local_19;
  LinuxKeyboard *local_18;
  LinuxKeyboard *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RSI;
  if ((_handleKeyPress(_XEvent&)::buf == '\0') &&
     (iVar2 = __cxa_guard_acquire(&_handleKeyPress(_XEvent&)::buf), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_19);
    __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&_handleKeyPress::buf,
                 &__dso_handle);
    __cxa_guard_release(&_handleKeyPress(_XEvent&)::buf);
  }
  uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffffbc);
  iVar2 = XFilterEvent(local_10,0);
  pLVar1 = local_18;
  uVar6 = (CONCAT13(iVar2 != 0,(int3)uVar5) ^ 0xff000000) & 0x1ffffff;
  if (*(long *)(in_RDI + 0x1e8) == 0) {
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&_handleKeyPress::buf,0);
    sVar3 = std::vector<char,_std::allocator<char>_>::size(&_handleKeyPress::buf);
    local_40 = XLookupString(pLVar1,pvVar4,sVar3 - 1 & 0xffffffff,local_38,0);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       (&_handleKeyPress::buf,(long)local_40);
    *pvVar4 = '\0';
  }
  else {
    do {
      in_stack_ffffffffffffff80 = *(allocator_type **)(in_RDI + 0x1e8);
      in_stack_ffffffffffffff88 = local_18;
      this_00 = (vector<char,_std::allocator<char>_> *)
                std::vector<char,_std::allocator<char>_>::operator[](&_handleKeyPress::buf,0);
      sVar3 = std::vector<char,_std::allocator<char>_>::size(&_handleKeyPress::buf);
      local_40 = Xutf8LookupString(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,this_00,
                                   (int)sVar3 + -1,local_38,&stack0xffffffffffffffb8);
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&_handleKeyPress::buf,(long)local_40);
      *pvVar4 = '\0';
      if (in_stack_ffffffffffffffb8 == -1) {
        std::vector<char,_std::allocator<char>_>::size(&_handleKeyPress::buf);
        std::vector<char,_std::allocator<char>_>::resize
                  (this_00,(size_type)in_stack_ffffffffffffff88);
      }
    } while (in_stack_ffffffffffffffb8 == -1);
  }
  if (((uVar6 & 0x1000000) != 0) && (0 < local_40)) {
    if (*(int *)(in_RDI + 0x50) == 1) {
      buf = (uchar *)std::vector<char,_std::allocator<char>_>::operator[](&_handleKeyPress::buf,0);
      UTF8ToUTF32(buf);
    }
    else if (*(int *)(in_RDI + 0x50) == 2) {
      std::vector<char,_std::allocator<char>_>::operator[](&_handleKeyPress::buf,0);
    }
  }
  if (((local_18->super_Keyboard).mTextMode & *(TextTranslationMode *)(in_RDI + 500)) == Off) {
    *(uint *)(in_RDI + 0x40) = *(uint *)(in_RDI + 0x40) & 0xffffefff;
  }
  else {
    *(uint *)(in_RDI + 0x40) = *(uint *)(in_RDI + 0x40) | 0x1000;
  }
  if (((local_18->super_Keyboard).mTextMode & *(TextTranslationMode *)(in_RDI + 0x1f8)) == Off) {
    *(uint *)(in_RDI + 0x40) = *(uint *)(in_RDI + 0x40) & 0xfffeffff;
  }
  else {
    *(uint *)(in_RDI + 0x40) = *(uint *)(in_RDI + 0x40) | 0x10000;
  }
  kc_00 = KeySymToOISKeyCode(in_stack_ffffffffffffff88,(KeySym)in_stack_ffffffffffffff80);
  _injectKeyDown((LinuxKeyboard *)CONCAT44(uVar6,in_stack_ffffffffffffffb8),kc_00,
                 in_stack_ffffffffffffffb0);
  if ((((local_18->super_Keyboard).mTextMode & 8) != Off) && (local_38[0] == 0xff09)) {
    LinuxInputManager::_setGrabState(*(LinuxInputManager **)(in_RDI + 0x38),false);
  }
  return;
}

Assistant:

void LinuxKeyboard::_handleKeyPress(XEvent& event)
{
	XKeyEvent& e = (XKeyEvent&)event;
	static std::vector<char> buf(32);
	KeySym keySym;
	unsigned int character = 0;
	int bytes			   = 0;
	bool haveChar		   = true;

	haveChar = !XFilterEvent(&event, None);

	if(xic)
	{
		Status status;
		do
		{
			bytes	   = Xutf8LookupString(xic, &e, &buf[0], buf.size() - 1, &keySym, &status);
			buf[bytes] = '\0';

			if(status == XBufferOverflow)
				buf.resize(buf.size() * 2);
		} while(status == XBufferOverflow);
	}
	else
	{
		bytes	   = XLookupString(&e, &buf[0], buf.size() - 1, &keySym, NULL);
		buf[bytes] = '\0';
	}

	if(haveChar && bytes > 0)
	{
		if(mTextMode == Unicode)
			character = UTF8ToUTF32(reinterpret_cast<unsigned char*>(&buf[0]));
		else if(mTextMode == Ascii)
			character = buf[0];
	}

	if(e.state & capsLockMask)
		mModifiers |= CapsLock;
	else
		mModifiers &= ~CapsLock;

	if(e.state & numLockMask)
		mModifiers |= NumLock;
	else
		mModifiers &= ~NumLock;

	KeyCode kc = KeySymToOISKeyCode(keySym);
	_injectKeyDown(kc, character);

	//Check for Alt-Tab
	LinuxInputManager* linMan = static_cast<LinuxInputManager*>(mCreator);
	if((e.state & Mod1Mask) && (keySym == XK_Tab))
		linMan->_setGrabState(false);
}